

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontmetrics.cpp
# Opt level: O0

qreal __thiscall QFontMetricsF::leftBearing(QFontMetricsF *this,QChar ch)

{
  bool bVar1;
  Type TVar2;
  uint uVar3;
  QFontPrivate *pQVar4;
  QFontEngine *this_00;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  glyph_t glyph;
  QFontEngine *engine;
  int script;
  qreal lb;
  QChar *in_stack_ffffffffffffffa8;
  QFontPrivate *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  QFontPrivate *this_01;
  QFontEngine *pQVar6;
  qreal local_20;
  qreal local_18;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QChar::script((QChar *)0x774f57);
  this_01 = (QFontPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x774f74);
  if ((((byte)pQVar4->field_0x7c >> 4 & 7) == 3) &&
     (bVar1 = QChar::isLower((QChar *)0x774f8e), bVar1)) {
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x774f9e);
    QFontPrivate::smallCapsFontPrivate
              ((QFontPrivate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    this_00 = QFontPrivate::engineForScript(this_01,in_stack_ffffffffffffffc4);
  }
  else {
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x774fc3);
    this_00 = QFontPrivate::engineForScript(this_01,in_stack_ffffffffffffffc4);
  }
  TVar2 = QFontEngine::type(this_00);
  if (TVar2 == Box) {
    local_20 = 0.0;
  }
  else {
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x774ff8);
    QFontPrivate::alterCharForCapitalization(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    pQVar6 = this_00;
    pcVar5 = QChar::unicode(&local_a);
    uVar3 = (*this_00->_vptr_QFontEngine[0xb])(this_00,(ulong)(ushort)*pcVar5);
    local_18 = -NAN;
    (*pQVar6->_vptr_QFontEngine[0x29])(pQVar6,(ulong)uVar3,&local_18,0);
    local_20 = local_18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

qreal QFontMetricsF::leftBearing(QChar ch) const
{
    const int script = ch.script();
    QFontEngine *engine;
    if (d->capital == QFont::SmallCaps && ch.isLower())
        engine = d->smallCapsFontPrivate()->engineForScript(script);
    else
        engine = d->engineForScript(script);
    Q_ASSERT(engine != nullptr);
    if (engine->type() == QFontEngine::Box)
        return 0;

    d->alterCharForCapitalization(ch);

    glyph_t glyph = engine->glyphIndex(ch.unicode());

    qreal lb;
    engine->getGlyphBearings(glyph, &lb);
    return lb;
}